

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

Node * __thiscall Patch::splay_node_starting_before<Patch::NewCoordinates>(Patch *this,Point target)

{
  pointer *pppNVar1;
  pointer ppNVar2;
  iterator iVar3;
  Node *pNVar4;
  bool bVar5;
  Point PVar6;
  Node *node;
  size_type __new_size;
  Point left_ancestor_end;
  Point node_start;
  Node *local_60;
  vector<Patch::Node*,std::allocator<Patch::Node*>> *local_58;
  Point local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_38 = target;
  Point::Point(&local_48);
  local_60 = this->root;
  ppNVar2 = (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar2) {
    (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar2;
  }
  if (local_60 != (Node *)0x0) {
    local_58 = (vector<Patch::Node*,std::allocator<Patch::Node*>> *)&this->node_stack;
    node = (Node *)0x0;
    __new_size = 0;
    do {
      local_50 = local_60->new_distance_from_left_ancestor;
      local_40 = Point::traverse(&local_48,&local_50);
      local_50 = local_60->new_extent;
      PVar6 = Point::traverse(&local_40,&local_50);
      bVar5 = Point::operator<=(&local_40,&local_38);
      pNVar4 = local_60;
      if (bVar5) {
        iVar3._M_current =
             (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        __new_size = (long)iVar3._M_current -
                     (long)(this->node_stack).
                           super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
        node = local_60;
        if (local_60->right == (Node *)0x0) break;
        local_48 = PVar6;
        if (iVar3._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>(local_58,iVar3,&local_60);
        }
        else {
          *iVar3._M_current = local_60;
          pppNVar1 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        local_60 = (Node *)&local_60->right;
        node = pNVar4;
      }
      else {
        if (local_60->left == (Node *)0x0) break;
        iVar3._M_current =
             (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->node_stack).super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>(local_58,iVar3,&local_60);
        }
        else {
          *iVar3._M_current = local_60;
          pppNVar1 = &(this->node_stack).
                      super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      local_60 = local_60->left;
    } while (local_60 != (Node *)0x0);
    if (node != (Node *)0x0) {
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize
                ((vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> *)local_58,__new_size);
      splay_node(this,node);
      return node;
    }
  }
  return (Node *)0x0;
}

Assistant:

Patch::Node *Patch::splay_node_starting_before(Point target) {
  Node *splayed_node = nullptr;
  Point left_ancestor_end = Point();
  Node *node = root;

  node_stack.clear();
  size_t splayed_node_ancestor_count = 0;
  while (node) {
    Point node_start = left_ancestor_end.traverse(
        CoordinateSpace::distance_from_left_ancestor(node));
    Point node_end = node_start.traverse(CoordinateSpace::extent(node));
    if (node_start <= target) {
      splayed_node = node;
      splayed_node_ancestor_count = node_stack.size();
      if (node->right) {
        left_ancestor_end = node_end;
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (splayed_node) {
    node_stack.resize(splayed_node_ancestor_count);
    splay_node(splayed_node);
  }

  return splayed_node;
}